

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

int lj_record_objcmp(jit_State *J,TRef a,TRef b,cTValue *av,cTValue *bv)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  cTValue *in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  cTValue *in_R8;
  IRType tb;
  IRType ta;
  int diff;
  uint local_6c;
  uint uVar4;
  uint local_60;
  TRef local_48;
  TRef local_44;
  
  iVar2 = lj_obj_equal(in_RCX,in_R8);
  uVar3 = (uint)((iVar2 != 0 ^ 0xffU) & 1);
  if (0x7fff < ((in_ESI | in_EDX) & 0xffff)) {
    if ((in_ESI >> 0x18 & 0x1f) - 0xf < 5) {
      uVar4 = 0x13;
    }
    else {
      uVar4 = in_ESI >> 0x18 & 0x1f;
    }
    if ((in_EDX >> 0x18 & 0x1f) - 0xf < 5) {
      local_6c = 0x13;
    }
    else {
      local_6c = in_EDX >> 0x18 & 0x1f;
    }
    local_60 = uVar4;
    local_48 = in_EDX;
    local_44 = in_ESI;
    if (uVar4 != local_6c) {
      if ((uVar4 == 0x13) && (local_6c == 0xe)) {
        *(undefined2 *)(in_RDI + 0xa4) = 0x590e;
        *(short *)(in_RDI + 0xa0) = (short)in_ESI;
        *(undefined2 *)(in_RDI + 0xa2) = 0x1d3;
        local_44 = lj_opt_fold((jit_State *)0xe00000013);
        local_60 = 0xe;
      }
      else {
        if ((uVar4 != 0xe) || (local_6c != 0x13)) {
          return 2;
        }
        *(undefined2 *)(in_RDI + 0xa4) = 0x590e;
        *(short *)(in_RDI + 0xa0) = (short)in_EDX;
        *(undefined2 *)(in_RDI + 0xa2) = 0x1d3;
        local_48 = lj_opt_fold((jit_State *)0x130000000e);
      }
    }
    sVar1 = 8;
    if (uVar3 != 0) {
      sVar1 = 9;
    }
    *(ushort *)(in_RDI + 0xa4) = sVar1 << 8 | (ushort)local_60 | 0x80;
    *(short *)(in_RDI + 0xa0) = (short)local_44;
    *(short *)(in_RDI + 0xa2) = (short)local_48;
    lj_opt_fold((jit_State *)CONCAT44(local_6c,uVar4));
  }
  return uVar3;
}

Assistant:

int lj_record_objcmp(jit_State *J, TRef a, TRef b, cTValue *av, cTValue *bv)
{
  int diff = !lj_obj_equal(av, bv);
  if (!tref_isk2(a, b)) {  /* Shortcut, also handles primitives. */
    IRType ta = tref_isinteger(a) ? IRT_INT : tref_type(a);
    IRType tb = tref_isinteger(b) ? IRT_INT : tref_type(b);
    if (ta != tb) {
      /* Widen mixed number/int comparisons to number/number comparison. */
      if (ta == IRT_INT && tb == IRT_NUM) {
	a = emitir(IRTN(IR_CONV), a, IRCONV_NUM_INT);
	ta = IRT_NUM;
      } else if (ta == IRT_NUM && tb == IRT_INT) {
	b = emitir(IRTN(IR_CONV), b, IRCONV_NUM_INT);
      } else {
	return 2;  /* Two different types are never equal. */
      }
    }
    emitir(IRTG(diff ? IR_NE : IR_EQ, ta), a, b);
  }
  return diff;
}